

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

char * GetBytecodeFromPath(ParseContext *ctx,Lexeme *start,IntrusiveList<SynIdentifier> parts)

{
  SmallArray<InplaceStr,_8U> *this;
  CompilerStatistics *this_00;
  InplaceStr *pIVar1;
  long lVar2;
  Allocator *pAVar3;
  ErrorInfo **ppEVar4;
  ArrayView<InplaceStr> AVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  undefined4 extraout_var;
  SynIdentifier *pSVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  IntrusiveList<SynIdentifier> parts_00;
  IntrusiveList<SynIdentifier> parts_01;
  char *pos;
  TraceScope traceScope;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> allocator;
  ChunkedStackPool<65532> pool;
  InplaceStr local_c8;
  Lexeme *local_b8;
  char *local_b0;
  SynIdentifier *local_a8;
  InplaceStr *local_a0;
  uint uStack_98;
  undefined4 uStack_94;
  TraceScope local_90;
  GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> local_80;
  ChunkedStackPool<65532> local_48;
  ErrorInfo *pEVar11;
  
  pSVar12 = parts.tail;
  parts_00.head = parts.head;
  local_b8 = start;
  uVar7 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar7;
  (ctx->statistics).finishTime = 0;
  parts_00.tail = pSVar12;
  local_c8 = GetModuleName(ctx->allocator,ctx->moduleRoot,parts_00);
  if ((GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::token == '\0') &&
     (iVar8 = __cxa_guard_acquire(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)
                                   ::token), iVar8 != 0)) {
    GetBytecodeFromPath::token = NULLC::TraceGetToken("parser","GetBytecodeFromPath");
    __cxa_guard_release(&GetBytecodeFromPath(ParseContext&,Lexeme*,IntrusiveList<SynIdentifier>)::
                         token);
  }
  NULLC::TraceScope::TraceScope(&local_90,GetBytecodeFromPath::token);
  lVar16 = NULLC::traceContext;
  pcVar9 = local_c8.begin;
  uVar15 = (long)local_c8.end - (long)local_c8.begin;
  iVar8 = (int)uVar15;
  if (iVar8 != 0) {
    uVar13 = iVar8 + 1;
    uVar7 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar7 <= *(int *)(NULLC::traceContext + 0x260) + uVar13) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar7 = *(uint *)(lVar16 + 0x264);
    }
    local_a8 = parts_00.head;
    if (uVar7 <= uVar13) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar7 = *(uint *)(lVar16 + 0x260);
    memcpy((void *)((ulong)uVar7 + *(long *)(lVar16 + 0x268)),pcVar9,uVar15 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar16 + 0x268) + (ulong)(uint)(*(int *)(lVar16 + 0x260) + iVar8)) = 0
    ;
    *(int *)(lVar16 + 0x260) = *(int *)(lVar16 + 0x260) + uVar13;
    lVar2 = *(long *)(lVar16 + 0x278);
    pSVar12 = (SynIdentifier *)(ulong)*(uint *)(lVar16 + 0x270);
    *(uint *)(lVar16 + 0x270) = *(uint *)(lVar16 + 0x270) + 1;
    *(uint *)(lVar2 + (long)pSVar12 * 8) = uVar7 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (long)pSVar12 * 8) = 0;
    parts_00.head = local_a8;
  }
  pcVar9 = BinaryCache::FindBytecode(local_c8.begin,false);
  if (pcVar9 == (char *)0x0) {
    parts_01.tail = pSVar12;
    parts_01.head = parts_00.head;
    local_c8 = GetModuleName(ctx->allocator,(char *)0x0,parts_01);
    pcVar9 = BinaryCache::FindBytecode(local_c8.begin,false);
  }
  this = &ctx->activeImports;
  if ((ctx->activeImports).count == 0) {
    uVar7 = 0;
  }
  else {
    lVar16 = 0;
    uVar15 = 0;
    do {
      bVar6 = InplaceStr::operator==((InplaceStr *)((long)&this->data->begin + lVar16),&local_c8);
      if (bVar6) {
        anon_unknown.dwarf_169315::Stop
                  (ctx,local_b8,"ERROR: found cyclic dependency on module \'%.*s\'",
                   (ulong)(uint)((int)local_c8.end - (int)local_c8.begin));
      }
      uVar15 = uVar15 + 1;
      uVar7 = (ctx->activeImports).count;
      lVar16 = lVar16 + 0x10;
    } while (uVar15 < uVar7);
  }
  if (uVar7 == (ctx->activeImports).max) {
    SmallArray<InplaceStr,_8U>::grow(this,uVar7);
  }
  if (this->data == (InplaceStr *)0x0) {
    pcVar9 = "void SmallArray<InplaceStr, 8>::push_back(const T &) [T = InplaceStr, N = 8]";
LAB_0021c46c:
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,pcVar9);
  }
  this_00 = &ctx->statistics;
  uVar7 = (ctx->activeImports).count;
  (ctx->activeImports).count = uVar7 + 1;
  pIVar1 = this->data + uVar7;
  *(undefined4 *)&pIVar1->begin = local_c8.begin._0_4_;
  *(undefined4 *)((long)&pIVar1->begin + 4) = local_c8.begin._4_4_;
  *(int *)&pIVar1->end = (int)local_c8.end;
  *(undefined4 *)((long)&pIVar1->end + 4) = local_c8.end._4_4_;
  if (pcVar9 == (char *)0x0) {
    if (ctx->bytecodeBuilder ==
        (_func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
         *)0x0) {
      anon_unknown.dwarf_169315::Stop(ctx,local_b8,"ERROR: import builder is not provided");
    }
    if (ctx->errorCount == 0) {
      ctx->errorPos = local_b8->pos;
      pcVar14 = ctx->errorBuf;
      ctx->errorBufLocation = pcVar14;
    }
    else {
      pcVar14 = ctx->errorBufLocation;
    }
    local_80.pool = &local_48;
    local_48.first = (StackChunk *)0x0;
    local_48.curr = (StackChunk *)0x0;
    local_48.size = 0xfffc;
    local_80.super_Allocator._vptr_Allocator = (_func_int **)&PTR__GrowingAllocatorRef_003e7580;
    local_80.total = 0;
    local_80.allocLimit = 0xffffffff;
    local_80.allocLimitContext = (void *)0x0;
    local_80.allocLimitCallback = (_func_void_void_ptr *)0x0;
    local_80.largeObjects.data = (void **)0x0;
    local_80.largeObjects.max = 0;
    local_80.largeObjects.count = 0;
    uVar7 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(this_00,"Extra",uVar7);
    local_b0 = (char *)0x0;
    local_a0 = (ctx->activeImports).data;
    uStack_98 = (ctx->activeImports).count;
    AVar5._12_4_ = uStack_94;
    AVar5.count = uStack_98;
    AVar5.data = local_a0;
    pcVar9 = (*ctx->bytecodeBuilder)
                       (&local_80.super_Allocator,local_c8,ctx->moduleRoot,false,&local_b0,
                        ctx->errorBufLocation,
                        (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize,
                        ctx->optimizationLevel,AVar5,this_00);
    uVar7 = NULLCTime::clockMicro();
    (ctx->statistics).startTime = uVar7;
    (ctx->statistics).finishTime = 0;
    if (pcVar9 == (char *)0x0) {
      if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
        pcVar17 = ctx->errorBufLocation;
        sVar10 = strlen(pcVar17);
        pcVar17 = pcVar17 + sVar10;
        ctx->errorBufLocation = pcVar17;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pEVar11 = (ErrorInfo *)CONCAT44(extraout_var,iVar8);
        pAVar3 = ctx->allocator;
        pEVar11->messageStart = pcVar14;
        pEVar11->messageEnd = pcVar17;
        pEVar11->begin = local_b8;
        pEVar11->end = local_b8;
        pEVar11->pos = local_b0;
        (pEVar11->related).allocator = pAVar3;
        (pEVar11->related).data = (pEVar11->related).little;
        (pEVar11->related).count = 0;
        (pEVar11->related).max = 4;
        pEVar11->parentModule = (ModuleData *)0x0;
        uVar7 = (ctx->errorInfo).count;
        if (uVar7 == (ctx->errorInfo).max) {
          SmallArray<ErrorInfo_*,_4U>::grow(&ctx->errorInfo,uVar7);
        }
        ppEVar4 = (ctx->errorInfo).data;
        if (ppEVar4 == (ErrorInfo **)0x0) {
          pcVar9 = "void SmallArray<ErrorInfo *, 4>::push_back(const T &) [T = ErrorInfo *, N = 4]";
          goto LAB_0021c46c;
        }
        uVar7 = (ctx->errorInfo).count;
        (ctx->errorInfo).count = uVar7 + 1;
        ppEVar4[uVar7] = pEVar11;
        AddErrorLocationInfo
                  (ctx->code,local_b0,ctx->errorBufLocation,
                   (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation) + ctx->errorBufSize);
        pcVar14 = ctx->errorBufLocation;
        sVar10 = strlen(pcVar14);
        ctx->errorBufLocation = pcVar14 + sVar10;
      }
      ctx->errorCount = ctx->errorCount + 1;
    }
    GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::~GrowingAllocatorRef(&local_80);
    ChunkedStackPool<65532>::~ChunkedStackPool(&local_48);
  }
  uVar7 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(this_00,"Extra",uVar7);
  NULLC::TraceScope::~TraceScope(&local_90);
  return pcVar9;
}

Assistant:

const char* GetBytecodeFromPath(ParseContext &ctx, Lexeme *start, IntrusiveList<SynIdentifier> parts)
{
	ctx.statistics.Start(NULLCTime::clockMicro());

	InplaceStr moduleName = GetModuleName(ctx.allocator, ctx.moduleRoot, parts);

	TRACE_SCOPE("parser", "GetBytecodeFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	const char *bytecode = BinaryCache::FindBytecode(moduleName.begin, false);

	if(!bytecode)
	{
		moduleName = GetModuleName(ctx.allocator, NULL, parts);

		bytecode = BinaryCache::FindBytecode(moduleName.begin, false);
	}

	for(unsigned i = 0; i < ctx.activeImports.size(); i++)
	{
		if(ctx.activeImports[i] == moduleName)
			Stop(ctx, start, "ERROR: found cyclic dependency on module '%.*s'", moduleName.length(), moduleName.begin);
	}

	ctx.activeImports.push_back(moduleName);

	if(!bytecode)
	{
		if(!ctx.bytecodeBuilder)
			Stop(ctx, start, "ERROR: import builder is not provided");

		if(ctx.errorCount == 0)
		{
			ctx.errorPos = start->pos;
			ctx.errorBufLocation = ctx.errorBuf;
		}

		const char *messageStart = ctx.errorBufLocation;

		// Separate allocator for each module
		ChunkedStackPool<65532> pool;
		GrowingAllocatorRef<ChunkedStackPool<65532>, 16384> allocator(pool);

		ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

		const char *pos = NULL;
		bytecode = ctx.bytecodeBuilder(&allocator, moduleName, ctx.moduleRoot, false, &pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), ctx.optimizationLevel, ctx.activeImports, &ctx.statistics);

		ctx.statistics.Start(NULLCTime::clockMicro());

		if(!bytecode)
		{
			if(ctx.errorBuf && ctx.errorBufSize)
			{
				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				ctx.errorInfo.push_back(new (ctx.get<ErrorInfo>()) ErrorInfo(ctx.allocator, messageStart, messageEnd, start, start, pos));

				AddErrorLocationInfo(ctx.code, pos, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			ctx.errorCount++;
		}
	}

	ctx.statistics.Finish("Extra", NULLCTime::clockMicro());

	return bytecode;
}